

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O0

error_or<int> * __thiscall
pstore::http::handle_version<ServeDynamicContent_Version_Test::TestBody()::__0,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_65350a3f sender,int io,
          query_container *param_3)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  time_point time;
  undefined1 auVar4 [16];
  string local_230 [32];
  http *local_210;
  duration local_208;
  string local_200;
  http *local_1e0;
  string local_1d8;
  ostringstream local_1b8 [8];
  ostringstream os;
  undefined1 local_29;
  undefined8 uStack_28;
  anon_class_1_0_00000001 version_string;
  query_container *param_4_local;
  int io_local;
  anon_class_8_1_65350a3f sender_local;
  
  uStack_28 = CONCAT44(in_register_0000000c,io);
  if (handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::version_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                                 ::version_abi_cxx11_);
    if (iVar1 != 0) {
      handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::{lambda()#1}::operator()[abi_cxx11_
                (&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                  ::version_abi_cxx11_,&local_29);
      __cxa_atexit(std::__cxx11::string::~string,
                   &handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::version_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                           ::version_abi_cxx11_);
    }
  }
  if (handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::modified == '\0') {
    iVar1 = __cxa_guard_acquire(&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                                 ::modified);
    if (iVar1 != 0) {
      handle_version<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_dynamic_content.cpp:47:19),_int>
      ::modified.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      __cxa_guard_release(&handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                           ::modified);
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar2 = std::operator<<((ostream *)local_1b8,"HTTP/1.1 200 OK");
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Connection: close");
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Content-length: ");
  uVar3 = std::__cxx11::string::length();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Content-type: application/json");
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Date: ");
  auVar4 = std::chrono::_V2::system_clock::now();
  local_1e0 = auVar4._0_8_;
  http_date_abi_cxx11_(&local_1d8,local_1e0,(duration)auVar4._8_8_);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Last-Modified: ");
  local_208 = handle_version<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_dynamic_content.cpp:47:19),_int>
              ::modified.__d.__r;
  http_date_abi_cxx11_
            (&local_200,
             (http *)handle_version<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_dynamic_content.cpp:47:19),_int>
                     ::modified.__d.__r,time);
  poVar2 = std::operator<<(poVar2,(string *)&local_200);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Server: ");
  poVar2 = std::operator<<(poVar2,"pstore-http");
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"\r\n");
  std::operator<<(poVar2,(string *)
                         &handle_version<ServeDynamicContent_Version_Test::TestBody()::$_0,int>(ServeDynamicContent_Version_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                          ::version_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d8);
  local_210 = this;
  std::__cxx11::ostringstream::str();
  send<ServeDynamicContent_Version_Test::TestBody()::__0,int>
            (__return_storage_ptr__,local_210,sender.output & 0xffffffff,(int)local_230,
             (string *)param_3);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> handle_version (Sender sender, IO io, query_container const &) {
            auto version_string = [] () {
                std::ostringstream os;
                os << R"({ "version": ")" << header::major_version << '.' << header::minor_version
                   << "\" }";
                auto const & v = os.str ();
                PSTORE_ASSERT (json::is_valid (v));
                return v;
            };
            static std::string const version = version_string ();
            static auto const modified = std::chrono::system_clock::now ();

            std::ostringstream os;
            os << "HTTP/1.1 200 OK" << crlf                                         //
               << "Connection: close" << crlf                                       //
               << "Content-length: " << version.length () << crlf                   //
               << "Content-type: application/json" << crlf                          //
               << "Date: " << http_date (std::chrono::system_clock::now ()) << crlf //
               << "Last-Modified: " << http_date (modified) << crlf                 //
               << "Server: " << server_name << crlf                                 //
               << crlf // End of headers
               << version;
            return pstore::http::send (sender, io, os.str ());
        }